

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::InternalMakeCopy
          (TemplateDictionary *this,TemplateString *name_of_copy,UnsafeArena *arena,
          TemplateDictionary *parent_dict,TemplateDictionary *template_global_dict_owner)

{
  uint uVar1;
  UnsafeArena *pUVar2;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_00;
  char *pcVar3;
  iterator iVar4;
  TemplateDictionary *this_01;
  VariableDict *pVVar5;
  _Rb_tree_node_base *p_Var6;
  TemplateDictionary *pTVar7;
  SectionDict *pSVar8;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *pvVar9;
  IncludeDict *pIVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  bool bVar15;
  TemplateString local_a0;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *local_78;
  value_type local_70;
  pair<ctemplate::small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
  local_48;
  
  if (this->template_global_dict_owner_ == this) {
    this_01 = (TemplateDictionary *)operator_new(0x70);
    TemplateDictionary(this_01,name_of_copy,arena);
  }
  else {
    if (arena == (UnsafeArena *)0x0) {
      __assert_fail("arena",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x11f,
                    "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                   );
    }
    if ((parent_dict != (TemplateDictionary *)0x0) && (parent_dict->arena_ != arena)) {
      __assert_fail("parent_dict ? arena == parent_dict->arena_ : true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x120,
                    "TemplateDictionary *ctemplate::TemplateDictionary::InternalMakeCopy(const TemplateString &, UnsafeArena *, TemplateDictionary *, TemplateDictionary *)"
                   );
    }
    this_01 = (TemplateDictionary *)BaseArena::GetMemory(&arena->super_BaseArena,0x70,8);
    TemplateDictionary(this_01,name_of_copy,arena,parent_dict,template_global_dict_owner);
  }
  if (this->variable_dict_ != (VariableDict *)0x0) {
    if (this_01->variable_dict_ == (VariableDict *)0x0) {
      pVVar5 = (VariableDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0xb0,8);
      pUVar2 = this_01->arena_;
      pVVar5->size_ = 0;
      (pVVar5->functor_).arena_ = pUVar2;
      this_01->variable_dict_ = pVVar5;
    }
    pVVar5 = this->variable_dict_;
    p_Var6 = (_Rb_tree_node_base *)0x0;
    if (pVVar5->size_ < 0) {
      p_Var6 = *(_Rb_tree_node_base **)((long)&pVVar5->field_2 + 0x20);
      p_Var14 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var14 = (_Rb_tree_node_base *)&pVVar5->field_2;
    }
    while( true ) {
      pVVar5 = this->variable_dict_;
      uVar1 = pVVar5->size_;
      if (p_Var14 == (_Rb_tree_node_base *)0x0) {
        p_Var11 = (_Rb_tree_node_base *)((long)&pVVar5->field_2 + 0x10);
        if ((int)uVar1 >= 0) {
          p_Var11 = (_Rb_tree_node_base *)0x0;
        }
        bVar15 = p_Var6 == p_Var11 && (int)uVar1 < 0;
      }
      else {
        p_Var11 = (_Rb_tree_node_base *)0x0;
        if (-1 < (int)uVar1) {
          p_Var11 = (_Rb_tree_node_base *)((long)&pVVar5->field_2 + (ulong)uVar1 * 0x28);
        }
        bVar15 = p_Var14 == p_Var11;
      }
      if (bVar15) break;
      this_00 = this_01->variable_dict_;
      p_Var11 = p_Var6 + 1;
      if (p_Var14 != (_Rb_tree_node_base *)0x0) {
        p_Var11 = p_Var14;
      }
      Memdup(&local_a0,this_01,(TemplateString *)&p_Var11->_M_parent);
      local_70.first = *(unsigned_long *)p_Var11;
      local_70.second._17_7_ = local_a0._17_7_;
      local_70.second.is_immutable_ = local_a0.is_immutable_;
      local_70.second.id_ = local_a0.id_;
      local_70.second.ptr_ = local_a0.ptr_;
      local_70.second.length_ = local_a0.length_;
      small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert(&local_48,this_00,&local_70);
      if (p_Var14 == (_Rb_tree_node_base *)0x0) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      }
      else {
        p_Var14 = (_Rb_tree_node_base *)&p_Var14[1]._M_parent;
      }
    }
  }
  pTVar7 = this->template_global_dict_;
  if (pTVar7 != (TemplateDictionary *)0x0) {
    pcVar3 = (pTVar7->name_).ptr_;
    local_a0.ptr_ = &local_a0.is_immutable_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,pcVar3,pcVar3 + (pTVar7->name_).length_);
    local_70.first = (unsigned_long)local_a0.ptr_;
    local_70.second.ptr_ = (char *)local_a0.length_;
    local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
    local_70.second.is_immutable_ = false;
    local_70.second._17_7_ = 0;
    pTVar7 = InternalMakeCopy(pTVar7,(TemplateString *)&local_70,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
    this_01->template_global_dict_ = pTVar7;
    if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
      operator_delete(local_a0.ptr_);
    }
  }
  if (this->section_dict_ != (SectionDict *)0x0) {
    if (this_01->section_dict_ == (SectionDict *)0x0) {
      pSVar8 = (SectionDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x50,8);
      pUVar2 = this_01->arena_;
      pSVar8->size_ = 0;
      (pSVar8->functor_).arena_ = pUVar2;
      this_01->section_dict_ = pSVar8;
    }
    pSVar8 = this->section_dict_;
    p_Var6 = (_Rb_tree_node_base *)0x0;
    if (pSVar8->size_ < 0) {
      p_Var6 = *(_Rb_tree_node_base **)((long)&pSVar8->field_2 + 0x20);
      p_Var14 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var14 = (_Rb_tree_node_base *)&pSVar8->field_2;
    }
    local_78 = p_Var14;
    while( true ) {
      pSVar8 = this->section_dict_;
      uVar1 = pSVar8->size_;
      if (p_Var14 == (_Rb_tree_node_base *)0x0) {
        p_Var11 = (_Rb_tree_node_base *)((long)&pSVar8->field_2 + 0x10);
        if ((int)uVar1 >= 0) {
          p_Var11 = (_Rb_tree_node_base *)0x0;
        }
        bVar15 = p_Var6 == p_Var11 && (int)uVar1 < 0;
      }
      else {
        p_Var11 = (_Rb_tree_node_base *)0x0;
        if (-1 < (int)uVar1) {
          p_Var11 = (_Rb_tree_node_base *)((long)&pSVar8->field_2 + (ulong)uVar1 * 0x10);
        }
        bVar15 = p_Var14 == p_Var11;
      }
      if (bVar15) break;
      pvVar9 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x20,8);
      *(UnsafeArena **)pvVar9 = this_01->arena_;
      *(undefined8 *)(pvVar9 + 8) = 0;
      *(undefined8 *)(pvVar9 + 0x10) = 0;
      *(undefined8 *)(pvVar9 + 0x18) = 0;
      p_Var11 = p_Var6 + 1;
      if (p_Var14 != (_Rb_tree_node_base *)0x0) {
        p_Var11 = p_Var14;
      }
      local_a0.ptr_ = *(char **)p_Var11;
      local_a0.length_ = (size_t)pvVar9;
      local_80 = p_Var6;
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&local_70,this_01->section_dict_,(value_type *)&local_a0);
      p_Var12 = p_Var11->_M_parent;
      for (p_Var13 = p_Var12->_M_parent; p_Var13 != p_Var12->_M_left;
          p_Var13 = (_Base_ptr)&p_Var13->_M_parent) {
        pTVar7 = *(TemplateDictionary **)p_Var13;
        pcVar3 = (pTVar7->name_).ptr_;
        local_a0.ptr_ = &local_a0.is_immutable_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (pTVar7->name_).length_);
        local_70.first = (unsigned_long)local_a0.ptr_;
        local_70.second.ptr_ = (char *)local_a0.length_;
        local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
        local_70.second.is_immutable_ = false;
        local_70.second._17_7_ = 0;
        local_48.first.array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             InternalMakeCopy(pTVar7,(TemplateString *)&local_70,this_01->arena_,this_01,
                              this_01->template_global_dict_owner_);
        iVar4._M_current = *(TemplateDictionary ***)(pvVar9 + 0x10);
        if (iVar4._M_current == *(TemplateDictionary ***)(pvVar9 + 0x18)) {
          std::
          vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
          ::_M_realloc_insert<ctemplate::TemplateDictionary*>
                    (pvVar9,iVar4,(TemplateDictionary **)&local_48);
        }
        else {
          *iVar4._M_current = (TemplateDictionary *)local_48.first.array_iter_;
          *(long *)(pvVar9 + 0x10) = *(long *)(pvVar9 + 0x10) + 8;
        }
        if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
          operator_delete(local_a0.ptr_);
        }
        p_Var12 = p_Var11->_M_parent;
      }
      if (local_78 == (_Rb_tree_node_base *)0x0) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_80);
        p_Var14 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var14 = (_Rb_tree_node_base *)&local_78->_M_left;
        p_Var6 = local_80;
        local_78 = p_Var14;
      }
    }
  }
  if (this->include_dict_ != (IncludeDict *)0x0) {
    if (this_01->include_dict_ == (IncludeDict *)0x0) {
      pIVar10 = (IncludeDict *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x50,8);
      pUVar2 = this_01->arena_;
      pIVar10->size_ = 0;
      (pIVar10->functor_).arena_ = pUVar2;
      this_01->include_dict_ = pIVar10;
    }
    pIVar10 = this->include_dict_;
    p_Var6 = (_Rb_tree_node_base *)0x0;
    if (pIVar10->size_ < 0) {
      p_Var6 = *(_Rb_tree_node_base **)((long)&pIVar10->field_2 + 0x20);
      p_Var14 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var14 = (_Rb_tree_node_base *)&pIVar10->field_2;
    }
    local_78 = p_Var14;
    while( true ) {
      pIVar10 = this->include_dict_;
      uVar1 = pIVar10->size_;
      if (p_Var14 == (_Rb_tree_node_base *)0x0) {
        p_Var11 = (_Rb_tree_node_base *)((long)&pIVar10->field_2 + 0x10);
        if ((int)uVar1 >= 0) {
          p_Var11 = (_Rb_tree_node_base *)0x0;
        }
        bVar15 = p_Var6 == p_Var11 && (int)uVar1 < 0;
      }
      else {
        p_Var11 = (_Rb_tree_node_base *)0x0;
        if (-1 < (int)uVar1) {
          p_Var11 = (_Rb_tree_node_base *)((long)&pIVar10->field_2 + (ulong)uVar1 * 0x10);
        }
        bVar15 = p_Var14 == p_Var11;
      }
      if (bVar15) break;
      pvVar9 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
                *)BaseArena::GetMemory(&this_01->arena_->super_BaseArena,0x20,8);
      *(UnsafeArena **)pvVar9 = this_01->arena_;
      *(undefined8 *)(pvVar9 + 8) = 0;
      *(undefined8 *)(pvVar9 + 0x10) = 0;
      *(undefined8 *)(pvVar9 + 0x18) = 0;
      p_Var11 = p_Var6 + 1;
      if (p_Var14 != (_Rb_tree_node_base *)0x0) {
        p_Var11 = p_Var14;
      }
      local_a0.ptr_ = *(char **)p_Var11;
      local_a0.length_ = (size_t)pvVar9;
      local_80 = p_Var6;
      small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
      ::insert((pair<ctemplate::small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>::iterator,_bool>
                *)&local_70,this_01->include_dict_,(value_type *)&local_a0);
      p_Var12 = p_Var11->_M_parent;
      for (p_Var13 = p_Var12->_M_parent; p_Var13 != p_Var12->_M_left;
          p_Var13 = (_Base_ptr)&p_Var13->_M_parent) {
        pTVar7 = *(TemplateDictionary **)p_Var13;
        pcVar3 = (pTVar7->name_).ptr_;
        local_a0.ptr_ = &local_a0.is_immutable_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (pTVar7->name_).length_);
        local_70.first = (unsigned_long)local_a0.ptr_;
        local_70.second.ptr_ = (char *)local_a0.length_;
        local_70.second.length_ = local_70.second.length_ & 0xffffffffffffff00;
        local_70.second.is_immutable_ = false;
        local_70.second._17_7_ = 0;
        local_48.first.array_iter_ =
             (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
             InternalMakeCopy(pTVar7,(TemplateString *)&local_70,this_01->arena_,
                              (TemplateDictionary *)0x0,this_01->template_global_dict_owner_);
        iVar4._M_current = *(TemplateDictionary ***)(pvVar9 + 0x10);
        if (iVar4._M_current == *(TemplateDictionary ***)(pvVar9 + 0x18)) {
          std::
          vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
          ::_M_realloc_insert<ctemplate::TemplateDictionary*>
                    (pvVar9,iVar4,(TemplateDictionary **)&local_48);
        }
        else {
          *iVar4._M_current = (TemplateDictionary *)local_48.first.array_iter_;
          *(long *)(pvVar9 + 0x10) = *(long *)(pvVar9 + 0x10) + 8;
        }
        if ((bool *)local_a0.ptr_ != &local_a0.is_immutable_) {
          operator_delete(local_a0.ptr_);
        }
        p_Var12 = p_Var11->_M_parent;
      }
      if (local_78 == (_Rb_tree_node_base *)0x0) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_80);
        p_Var14 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var14 = (_Rb_tree_node_base *)&local_78->_M_left;
        p_Var6 = local_80;
        local_78 = p_Var14;
      }
    }
  }
  local_a0.ptr_ = "";
  if (this->filename_ != (char *)0x0) {
    local_a0.ptr_ = this->filename_;
  }
  local_a0.length_ = strlen(local_a0.ptr_);
  local_a0.is_immutable_ = false;
  local_a0.id_ = 0;
  Memdup((TemplateString *)&local_70,this_01,&local_a0);
  this_01->filename_ = (char *)local_70.first;
  return this_01;
}

Assistant:

TemplateDictionary* TemplateDictionary::InternalMakeCopy(
    const TemplateString& name_of_copy,
    UnsafeArena* arena,
    TemplateDictionary* parent_dict,
    TemplateDictionary* template_global_dict_owner) {

  TemplateDictionary* newdict;
  if (template_global_dict_owner_ == this) {
    // We're a root-level template.  We want the copy to be just like
    // us, and have its own template_global_dict_, that it owns.
    // We use the normal global new, since newdict will be returned
    // to the user.
    newdict = new TemplateDictionary(name_of_copy, arena);
  } else {                          // recursive calls use private contructor
    // We're not a root-level template, so we want the copy to refer to the
    // same template_global_dict_ owner that we do.
    // Note: we always use our own arena, even when we have a parent
    //       (though we have the same arena as our parent when we have one).
    assert(arena);
    assert(parent_dict ? arena == parent_dict->arena_ : true);
    newdict = CreateTemplateSubdict(name_of_copy, arena,
                                    parent_dict, template_global_dict_owner);
  }

  // Copy the variable dictionary
  if (variable_dict_) {
    newdict->LazilyCreateDict(&newdict->variable_dict_);
    for (VariableDict::const_iterator it = variable_dict_->begin();
         it != variable_dict_->end(); ++it) {
      newdict->variable_dict_->insert(make_pair(it->first,
                                                newdict->Memdup(it->second)));
    }
  }
  // ...and the template-global-dict, if we have one (only root-level tpls do)
  if (template_global_dict_) {
    newdict->template_global_dict_ = template_global_dict_->InternalMakeCopy(
        template_global_dict_->name(), newdict->arena_, newdict,
        newdict->template_global_dict_owner_);
  }
  // Copy the section dictionary
  if (section_dict_) {
    newdict->LazilyCreateDict(&newdict->section_dict_);
    for (SectionDict::iterator it = section_dict_->begin();
         it != section_dict_->end(); ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->section_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in newdict as the parent of our new dict.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             newdict, newdict->template_global_dict_owner_));
      }
    }
  }
  // Copy the includes-dictionary
  if (include_dict_) {
    newdict->LazilyCreateDict(&newdict->include_dict_);
    for (IncludeDict::iterator it = include_dict_->begin();
         it != include_dict_->end();  ++it) {
      DictVector* dicts = newdict->CreateDictVector();
      newdict->include_dict_->insert(make_pair(it->first, dicts));
      for (DictVector::iterator it2 = it->second->begin();
           it2 != it->second->end(); ++it2) {
        TemplateDictionary* subdict = *it2;
        // In this case, we pass in NULL as the parent of our new dict:
        // parents are not inherited across include-dictionaries.
        dicts->push_back(subdict->InternalMakeCopy(
                             subdict->name(), newdict->arena_,
                             NULL, newdict->template_global_dict_owner_));
      }
    }
  }

  // Finally, copy everything else not set properly by the constructor
  newdict->filename_ = newdict->Memdup(filename_).ptr_;

  return newdict;
}